

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

void Shr_ManComputeTruths
               (Gia_Man_t *p,int nVars,Vec_Int_t *vDivs,Vec_Wrd_t *vDivTruths,Vec_Wrd_t *vTruths)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  word wVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  word *pwVar7;
  
  vDivTruths->nSize = 0;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < nVars) {
    uVar5 = (ulong)(uint)nVars;
  }
  pwVar7 = Truth;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = Vec_IntEntry(vDivs,(int)uVar6);
    wVar3 = *pwVar7;
    Vec_WrdWriteEntry(vTruths,iVar1,wVar3);
    Vec_WrdPush(vDivTruths,wVar3);
    pwVar7 = pwVar7 + 1;
  }
  for (; nVars < vDivs->nSize; nVars = nVars + 1) {
    iVar1 = Vec_IntEntry(vDivs,nVars);
    pGVar2 = Gia_ManObj(p,iVar1);
    wVar3 = Vec_WrdEntry(vTruths,iVar1 - (*(uint *)pGVar2 & 0x1fffffff));
    wVar4 = Vec_WrdEntry(vTruths,iVar1 - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff));
    uVar5 = ((*(long *)pGVar2 << 2) >> 0x3f ^ wVar4) & ((*(long *)pGVar2 << 0x22) >> 0x3f ^ wVar3);
    Vec_WrdWriteEntry(vTruths,iVar1,uVar5);
    Vec_WrdPush(vDivTruths,uVar5);
  }
  return;
}

Assistant:

void Shr_ManComputeTruths( Gia_Man_t * p, int nVars, Vec_Int_t * vDivs, Vec_Wrd_t * vDivTruths, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;//, Truthh;
    int i, iDiv;
    Vec_WrdClear( vDivTruths );
    Vec_IntForEachEntryStop( vDivs, iDiv, i, nVars )
    {
        Vec_WrdWriteEntry( vTruths, iDiv, Truth[i] );
        Vec_WrdPush( vDivTruths, Truth[i] );
    }
    Vec_IntForEachEntryStart( vDivs, iDiv, i, nVars )
    {
        pObj = Gia_ManObj( p, iDiv );
        Truth0 = Vec_WrdEntry( vTruths, Gia_ObjFaninId0(pObj, iDiv) );
        Truth1 = Vec_WrdEntry( vTruths, Gia_ObjFaninId1(pObj, iDiv) );
        if ( Gia_ObjFaninC0(pObj) )
            Truth0 = ~Truth0;
        if ( Gia_ObjFaninC1(pObj) )
            Truth1 = ~Truth1;
        Vec_WrdWriteEntry( vTruths, iDiv, Truth0 & Truth1 );
        Vec_WrdPush( vDivTruths, Truth0 & Truth1 );

//        Truthh = Truth0 & Truth1;
//        Abc_TtPrintBinary( &Truthh, nVars );   //printf( "\n" );
//        Kit_DsdPrintFromTruth( &Truthh, nVars );    printf( "\n" );
    }
//    printf( "\n" );
}